

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O0

bool __thiscall
anurbs::RTree<2L>::PickByRay::operator()(PickByRay *this,Vector *box_min,Vector *box_max)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Scalar SVar4;
  bool bVar5;
  CoeffReturnType pdVar6;
  Scalar *pSVar7;
  Scalar *pSVar8;
  long local_e8;
  Index i_3;
  Index i_2;
  Index i_1;
  Index i;
  undefined1 local_b8 [8];
  Vector coordinate;
  Matrix<double,1,2,1,1,2> local_98 [8];
  Vector candidate_plane;
  Matrix<double,1,2,1,1,2> local_78 [8];
  Vector max_t;
  int local_5c;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>_>
  local_58 [4];
  int which_plane;
  Matrix<unsigned_long,1,2,1,1,2> local_48 [8];
  VectorU quadrant;
  bool inside;
  Vector *box_max_local;
  Vector *box_min_local;
  PickByRay *this_local;
  
  bVar5 = true;
  Eigen::DenseBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>::Zero();
  Eigen::Matrix<unsigned_long,1,2,1,1,2>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,Eigen::Matrix<unsigned_long,1,2,1,1,2>>>
            (local_48,local_58);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::Zero();
  Eigen::Matrix<double,1,2,1,1,2>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>>>
            (local_78,(EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                       *)(candidate_plane.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                          m_data.array + 1));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::Zero();
  Eigen::Matrix<double,1,2,1,1,2>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>>>
            (local_98,(EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                       *)(coordinate.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                          m_storage.m_data.array + 1));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::Zero();
  Eigen::Matrix<double,1,2,1,1,2>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>>>
            ((Matrix<double,1,2,1,1,2> *)local_b8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
              *)&i);
  for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
    pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)this,i_1);
    dVar1 = *pdVar6;
    pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)box_min,i_1);
    if (*pdVar6 <= dVar1) {
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)this,i_1);
      dVar1 = *pdVar6;
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)box_max,i_1);
      if (dVar1 < *pdVar6 || dVar1 == *pdVar6) {
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1> *)
                            local_48,i_1);
        *pSVar7 = 0;
      }
      else {
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1> *)
                            local_48,i_1);
        *pSVar7 = 1;
        pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)box_max,i_1)
        ;
        dVar1 = *pdVar6;
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_98,i_1
                           );
        *pSVar8 = dVar1;
        bVar5 = false;
      }
    }
    else {
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1> *)
                          local_48,i_1);
      *pSVar7 = 0xffffffffffffffff;
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)box_min,i_1);
      dVar1 = *pdVar6;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_98,i_1);
      *pSVar8 = dVar1;
      bVar5 = false;
    }
  }
  if (bVar5) {
    Eigen::Matrix<double,_1,_2,_1,_1,_2>::operator=
              ((Matrix<double,_1,_2,_1,_1,_2> *)local_b8,&this->m_origin);
    this_local._7_1_ = true;
  }
  else {
    for (i_2 = 0; i_2 < 2; i_2 = i_2 + 1) {
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1> *)
                          local_48,i_2);
      if (*pSVar7 == 0) {
LAB_0037f77e:
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_78,i_2
                           );
        *pSVar8 = -1.0;
      }
      else {
        pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)
                            &this->m_direction,i_2);
        if ((*pdVar6 == 0.0) && (!NAN(*pdVar6))) goto LAB_0037f77e;
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_98,i_2
                           );
        dVar1 = *pSVar8;
        pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)this,i_2);
        dVar2 = *pdVar6;
        pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)
                            &this->m_direction,i_2);
        dVar3 = *pdVar6;
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_78,i_2
                           );
        *pSVar8 = (dVar1 - dVar2) / dVar3;
      }
    }
    local_5c = 0;
    for (i_3 = 1; i_3 < 2; i_3 = i_3 + 1) {
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_78,
                          (long)local_5c);
      dVar1 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_78,i_3);
      if (dVar1 < *pSVar8) {
        local_5c = (int)i_3;
      }
    }
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_78,
                        (long)local_5c);
    if (0.0 < *pSVar8 || *pSVar8 == 0.0) {
      for (local_e8 = 0; local_e8 < 2; local_e8 = local_e8 + 1) {
        if (local_5c == local_e8) {
          pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_98,
                              local_e8);
          SVar4 = *pSVar8;
          pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_b8,
                              local_e8);
          *pSVar8 = SVar4;
        }
        else {
          pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)this,
                              local_e8);
          dVar1 = *pdVar6;
          pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_78,
                              (long)local_5c);
          dVar2 = *pSVar8;
          pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)
                              &this->m_direction,local_e8);
          dVar3 = *pdVar6;
          pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_b8,
                              local_e8);
          *pSVar8 = dVar2 * dVar3 + dVar1;
          pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_b8,
                              local_e8);
          dVar1 = *pSVar8;
          pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)box_min,
                              local_e8);
          if (dVar1 < *pdVar6) {
            return false;
          }
          pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_b8,
                              local_e8);
          dVar1 = *pSVar8;
          pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)box_max,
                              local_e8);
          if (*pdVar6 <= dVar1 && dVar1 != *pdVar6) {
            return false;
          }
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(const Vector box_min, const Vector box_max) const noexcept
        {
            // based on Fast Ray-Box Intersection
            // by Andrew Woo
            // from "Graphics Gems", Academic Press, 1990

            bool inside = true;
            VectorU quadrant = VectorU::Zero(); // FIXME: choose other type...
            int which_plane = 0;
            Vector max_t = Vector::Zero();
            Vector candidate_plane = Vector::Zero();
            Vector coordinate = Vector::Zero();

            for (Index i = 0; i < TDimension; i++) {
                if (m_origin[i] < box_min[i]) {
                    quadrant[i] = -1;
                    candidate_plane[i] = box_min[i];
                    inside = false;
                } else if (m_origin[i] > box_max[i]) {
                    quadrant[i] = 1;
                    candidate_plane[i] = box_max[i];
                    inside = false;
                } else {
                    quadrant[i] = 0;
                }
            }

            if (inside) {
                coordinate = m_origin;
                return true;
            }

            for (Index i = 0; i < TDimension; i++) {
                if (quadrant[i] != 0 && m_direction[i] != 0) {
                    max_t[i] = (candidate_plane[i] - m_origin[i]) / m_direction[i];
                } else {
                    max_t[i] = -1;
                }
            }

            which_plane = 0;
            
            for (Index i = 1; i < TDimension; i++) {
                if (max_t[which_plane] < max_t[i]) {
                    which_plane = i;
                }
            }

            if (max_t[which_plane] < 0) {
                return false;
            }

            for (Index i = 0; i < TDimension; i++) {
                if (which_plane != i) {
                    coordinate[i] = m_origin[i] + max_t[which_plane] * m_direction[i];
                    if (coordinate[i] < box_min[i] || coordinate[i] > box_max[i]) {
                        return false;
                    }
                } else {
                    coordinate[i] = candidate_plane[i];
                }
            }

            return true;
        }